

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall Catch::Matchers::Impl::StdString::Equals::match(Equals *this,string *expr)

{
  __type _Var1;
  undefined1 local_38 [40];
  string *expr_local;
  Equals *this_local;
  
  local_38._32_8_ = expr;
  expr_local = (string *)this;
  CasedString::adjustString((CasedString *)local_38,(string *)&this->m_data);
  _Var1 = std::operator==(&(this->m_data).m_str,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_38);
  std::__cxx11::string::~string((string *)local_38);
  return _Var1;
}

Assistant:

virtual bool match(std::string const& expr) const {
						return m_data.m_str == m_data.adjustString(expr);;
					}